

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_setuid_fails(void)

{
  __uid_t _Var1;
  int iVar2;
  passwd *ppVar3;
  undefined8 uVar4;
  uv_loop_t *loop;
  char *pcVar5;
  
  _Var1 = getuid();
  if (_Var1 == 0) {
    ppVar3 = getpwnam("nobody");
    if (ppVar3 == (passwd *)0x0) {
      pcVar5 = "pw != NULL";
      uVar4 = 0x593;
      goto LAB_0014f820;
    }
    iVar2 = setgid(ppVar3->pw_gid);
    if (iVar2 != 0) {
      pcVar5 = "0 == setgid(pw->pw_gid)";
      uVar4 = 0x594;
      goto LAB_0014f820;
    }
    iVar2 = setuid(ppVar3->pw_uid);
    if (iVar2 != 0) {
      pcVar5 = "0 == setuid(pw->pw_uid)";
      uVar4 = 0x595;
      goto LAB_0014f820;
    }
  }
  init_process_options("spawn_helper1",fail_cb);
  options.uid = 0;
  options.flags._0_1_ = (byte)options.flags | 0x75;
  uVar4 = uv_default_loop();
  iVar2 = uv_spawn(uVar4,&process,&options);
  if (iVar2 == -1) {
    uVar4 = uv_default_loop();
    iVar2 = uv_run(uVar4,0);
    if (iVar2 == 0) {
      if (close_cb_called == 0) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar4 = uv_default_loop();
        iVar2 = uv_loop_close(uVar4);
        if (iVar2 == 0) {
          return 0;
        }
        pcVar5 = "0 == uv_loop_close(uv_default_loop())";
        uVar4 = 0x5af;
      }
      else {
        pcVar5 = "close_cb_called == 0";
        uVar4 = 0x5ad;
      }
    }
    else {
      pcVar5 = "r == 0";
      uVar4 = 0x5ab;
    }
  }
  else {
    pcVar5 = "r == UV_EPERM";
    uVar4 = 0x5a7;
  }
LAB_0014f820:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(spawn_setuid_fails) {
  int r;

  /* if root, become nobody. */
  uv_uid_t uid = getuid();
  if (uid == 0) {
    struct passwd* pw;
    pw = getpwnam("nobody");
    ASSERT(pw != NULL);
    ASSERT(0 == setgid(pw->pw_gid));
    ASSERT(0 == setuid(pw->pw_uid));
  }

  init_process_options("spawn_helper1", fail_cb);

  options.flags |= UV_PROCESS_SETUID;
  options.uid = 0;

  /* These flags should be ignored on Unices. */
  options.flags |= UV_PROCESS_WINDOWS_HIDE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_CONSOLE;
  options.flags |= UV_PROCESS_WINDOWS_HIDE_GUI;
  options.flags |= UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS;

  r = uv_spawn(uv_default_loop(), &process, &options);
#if defined(__CYGWIN__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EPERM);
#endif

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}